

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiViewportP::ImGuiViewportP(ImGuiViewportP *this)

{
  ImDrawData *in_RDI;
  ImDrawDataBuilder *in_stack_00000010;
  
  ImGuiViewport::ImGuiViewport((ImGuiViewport *)in_RDI);
  ImDrawData::ImDrawData(in_RDI);
  ImDrawDataBuilder::ImDrawDataBuilder(in_stack_00000010);
  ImVec2::ImVec2((ImVec2 *)&in_RDI[3].TotalIdxCount);
  ImVec2::ImVec2((ImVec2 *)&in_RDI[3].CmdLists);
  ImVec2::ImVec2(&in_RDI[3].DisplayPos);
  ImVec2::ImVec2(&in_RDI[3].DisplaySize);
  in_RDI[1].CmdListsCount = -1;
  *(undefined4 *)(in_RDI + 1) = 0xffffffff;
  in_RDI[1].CmdLists = (ImDrawList **)0x0;
  in_RDI[1].TotalIdxCount = 0;
  in_RDI[1].TotalVtxCount = 0;
  return;
}

Assistant:

ImGuiViewportP()    { DrawListsLastFrame[0] = DrawListsLastFrame[1] = -1; DrawLists[0] = DrawLists[1] = NULL; }